

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O2

prsndef * prsnew2(prscxdef *ctx,int t,prsndef *n1,prsndef *n2)

{
  prsndef *ppVar1;
  
  ppVar1 = (prsndef *)prsbalo(ctx,0x18);
  ppVar1->prsntyp = t;
  ppVar1->prsnnlf = 2;
  (ppVar1->prsnv).prsnvn[0] = n1;
  (ppVar1->prsnv).prsnvn[1] = n2;
  return ppVar1;
}

Assistant:

prsndef *prsnew2(prscxdef *ctx, int t, prsndef *n1, prsndef *n2)
{
    prsndef *n = prsalo(ctx, 2);
    
    n->prsntyp = t;
    n->prsnnlf = 2;
    n->prsnv.prsnvn[0] = n1;
    n->prsnv.prsnvn[1] = n2;
    return(n);
}